

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_surrogate(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL all_read;
  REF_FACELIFT ref_facelift;
  REF_GRID surrogate;
  REF_GLOB nnode;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  nnode = (REF_GLOB)ref_grid->mpi;
  surrogate = (REF_GRID)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)ref_grid;
  ref_grid_local._4_4_ = ref_import_by_extension((REF_GRID *)&ref_facelift,(REF_MPI)nnode,filename);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_geom_share_context
                   ((REF_GEOM)ref_facelift[2].edge_search,*(REF_GEOM *)(filename_local + 0x98));
    if (ref_grid_local._4_4_ == 0) {
      if (ref_facelift[2].edge_search[0x12] != (REF_SEARCH)0x0) {
        uVar1 = ref_egads_mark_jump_degen((REF_GRID)ref_facelift);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x207,"ref_facelift_surrogate",(ulong)uVar1,"T and UV jumps; UV degen");
          return uVar1;
        }
        uVar1 = ref_geom_verify_topo((REF_GRID)ref_facelift);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x208,"ref_facelift_surrogate",(ulong)uVar1,"geom topo");
          return uVar1;
        }
      }
      ref_grid_local._4_4_ =
           ref_facelift_create((REF_FACELIFT *)&ref_private_macro_code_rss,(REF_GRID)ref_facelift,1)
      ;
      if (ref_grid_local._4_4_ == 0) {
        *(REF_FACELIFT *)(*(long *)(filename_local + 0x98) + 0xe8) = _ref_private_macro_code_rss;
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x20a,"ref_facelift_surrogate",(ulong)ref_grid_local._4_4_,"create");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x205,"ref_facelift_surrogate",(ulong)ref_grid_local._4_4_,"share context");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1f5,"ref_facelift_surrogate",(ulong)ref_grid_local._4_4_,"import");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_surrogate(REF_GRID ref_grid,
                                          const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GLOB nnode = 0;
  REF_GRID surrogate;
  REF_FACELIFT ref_facelift;
  REF_BOOL all_read = REF_TRUE;
  if (all_read) {
    RSS(ref_import_by_extension(&surrogate, ref_mpi, filename), "import");
  } else {
    if (ref_mpi_once(ref_mpi)) {
      RSS(ref_import_by_extension(&surrogate, ref_mpi, filename), "import");
      nnode = ref_node_n_global(ref_grid_node(surrogate));
      RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_GLOB_TYPE), "bcast nnode");
    } else {
      RSS(ref_grid_create(&surrogate, ref_mpi), "create grid");
      RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_GLOB_TYPE), "bcast nnode");
      RSS(ref_node_initialize_n_global(ref_grid_node(surrogate), nnode),
          "init nnodesg");
    }
    /* performance regression in ref_geom_ghost */
    RSS(ref_migrate_replicate_ghost(surrogate), "replicant");
  }
  RSS(ref_geom_share_context(ref_grid_geom(surrogate), ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_grid_geom(surrogate))) {
    RSS(ref_egads_mark_jump_degen(surrogate), "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(surrogate), "geom topo");
  }
  RSS(ref_facelift_create(&ref_facelift, surrogate, REF_TRUE), "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  return REF_SUCCESS;
}